

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O3

int __thiscall
vkt::sr::anon_unknown_0::LinearDerivateCaseInstance::verify
          (LinearDerivateCaseInstance *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  ostringstream *poVar1;
  Precision precision;
  DerivateCaseDefinition *pDVar2;
  DerivateCaseValues *pDVar3;
  ulong uVar4;
  Vec4 VVar5;
  int i;
  bool bVar6;
  DataType DVar7;
  int iVar8;
  undefined8 *puVar9;
  undefined7 extraout_var;
  undefined8 uVar10;
  undefined7 extraout_var_00;
  long lVar11;
  Vector<float,_4> *pVVar12;
  long lVar13;
  int row;
  long lVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  float fVar23;
  float afVar19 [4];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar24;
  float fVar25;
  undefined1 auVar22 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  float fVar34;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined4 uVar38;
  Vector<float,_2> res_3;
  Vec4 threshold_1;
  Vec4 reference;
  Vec4 threshold;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  Vec4 surfaceThreshold;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  ConstPixelBufferAccess *local_1e0;
  Vec4 opThreshold;
  Vector<float,_4> res_15;
  Linear2DFunctionEvaluator function;
  ios_base local_140 [272];
  long lVar37;
  
  local_228 = 0x3f800000;
  uStack_220 = 0xbf0000003f000000;
  local_1f8 = 0x3f80000000000000;
  uStack_1f0 = 0xbf0000003f000000;
  pDVar2 = (this->super_TriangleDerivateCaseInstance).m_definitions;
  TriangleDerivateCaseInstance::getSurfaceThreshold((TriangleDerivateCaseInstance *)&function);
  pDVar3 = (this->super_TriangleDerivateCaseInstance).m_values;
  auVar26 = *(undefined1 (*) [16])(pDVar3->derivScale).m_data;
  auVar29._0_8_ = auVar26._0_8_ ^ 0x8000000080000000;
  auVar29._8_4_ = auVar26._8_4_ ^ 0x80000000;
  auVar29._12_4_ = auVar26._12_4_ ^ 0x80000000;
  auVar26 = maxps(auVar29,auVar26);
  afVar19 = (float  [4])divps(function.matrix.m_data.m_data[0].m_data,auVar26);
  surfaceThreshold.m_data[0] = afVar19[0];
  surfaceThreshold.m_data[1] = afVar19[1];
  surfaceThreshold.m_data[2] = afVar19[2];
  surfaceThreshold.m_data[3] = afVar19[3];
  if (pDVar2->func < DERIVATE_DFDY) {
    puVar9 = &local_228;
    lVar11 = 8;
  }
  else {
    if (2 < pDVar2->func - DERIVATE_DFDY) {
      auVar26._0_4_ = (float)*(int *)(ctx + 8);
      auVar27._0_4_ = (float)*(int *)(ctx + 0xc);
      auVar35._0_4_ = (pDVar3->coordMax).m_data[0] - (pDVar3->coordMin).m_data[0];
      auVar35._4_4_ = (pDVar3->coordMax).m_data[1] - (pDVar3->coordMin).m_data[1];
      auVar35._8_4_ = (pDVar3->coordMax).m_data[2] - (pDVar3->coordMin).m_data[2];
      auVar35._12_4_ = (pDVar3->coordMax).m_data[3] - (pDVar3->coordMin).m_data[3];
      auVar26._4_4_ = auVar26._0_4_;
      auVar26._8_4_ = auVar26._0_4_;
      auVar26._12_4_ = auVar26._0_4_;
      auVar26 = divps(auVar35,auVar26);
      function.matrix.m_data.m_data[0].m_data[0] = auVar26._0_4_ * (float)local_228;
      function.matrix.m_data.m_data[0].m_data[1] = auVar26._4_4_ * local_228._4_4_;
      function.matrix.m_data.m_data[0].m_data[2] = auVar26._8_4_ * (float)uStack_220;
      function.matrix.m_data.m_data[0].m_data[3] = auVar26._12_4_ * uStack_220._4_4_;
      auVar32._0_4_ = (pDVar3->coordMax).m_data[0] - (pDVar3->coordMin).m_data[0];
      auVar32._4_4_ = (pDVar3->coordMax).m_data[1] - (pDVar3->coordMin).m_data[1];
      auVar32._8_4_ = (pDVar3->coordMax).m_data[2] - (pDVar3->coordMin).m_data[2];
      auVar32._12_4_ = (pDVar3->coordMax).m_data[3] - (pDVar3->coordMin).m_data[3];
      auVar27._4_4_ = auVar27._0_4_;
      auVar27._8_4_ = auVar27._0_4_;
      auVar27._12_4_ = auVar27._0_4_;
      auVar26 = divps(auVar32,auVar27);
      reference.m_data[0] = auVar26._0_4_ * (float)local_1f8;
      reference.m_data[1] = auVar26._4_4_ * local_1f8._4_4_;
      reference.m_data[2] = auVar26._8_4_ * (float)uStack_1f0;
      reference.m_data[3] = auVar26._12_4_ * uStack_1f0._4_4_;
      uVar4 = CONCAT44(function.matrix.m_data.m_data[0].m_data[1],
                       function.matrix.m_data.m_data[0].m_data[0]);
      auVar28._0_8_ = uVar4 ^ 0x8000000080000000;
      auVar28._8_4_ = -function.matrix.m_data.m_data[0].m_data[2];
      auVar28._12_4_ = -function.matrix.m_data.m_data[0].m_data[3];
      auVar29 = maxps(auVar28,(undefined1  [16])function.matrix.m_data.m_data[0].m_data);
      uVar4 = CONCAT44(reference.m_data[1],reference.m_data[0]);
      auVar21._0_8_ = uVar4 ^ 0x8000000080000000;
      auVar21._8_4_ = -reference.m_data[2];
      auVar21._12_4_ = -reference.m_data[3];
      auVar26 = maxps(auVar21,(undefined1  [16])reference.m_data);
      opThreshold.m_data[0] = auVar26._0_4_ + auVar29._0_4_;
      opThreshold.m_data[1] = auVar26._4_4_ + auVar29._4_4_;
      opThreshold.m_data[2] = auVar26._8_4_ + auVar29._8_4_;
      opThreshold.m_data[3] = auVar26._12_4_ + auVar29._12_4_;
      precision = pDVar2->precision;
      fVar23 = (pDVar3->coordMin).m_data[2] * (float)uStack_220;
      fVar25 = (pDVar3->coordMin).m_data[3] * uStack_220._4_4_;
      local_218 = &pDVar3->derivScale;
      res_3.m_data[1] = (pDVar3->coordMin).m_data[1] * local_228._4_4_;
      res_3.m_data[0] = (pDVar3->coordMin).m_data[0] * (float)local_228;
      threshold_1.m_data[1] = (pDVar3->coordMax).m_data[1] * local_228._4_4_;
      threshold_1.m_data[0] = (pDVar3->coordMax).m_data[0] * (float)local_228;
      threshold_1.m_data[3] = (pDVar3->coordMax).m_data[3] * uStack_220._4_4_;
      threshold_1.m_data[2] = (pDVar3->coordMax).m_data[2] * (float)uStack_220;
      local_1e0 = (ConstPixelBufferAccess *)ctx;
      getDerivateThreshold
                ((anon_unknown_0 *)&threshold,precision,(Vec4 *)&res_3,&threshold_1,
                 (Vec4 *)&function);
      threshold_1.m_data[1] = (pDVar3->coordMin).m_data[1] * local_1f8._4_4_;
      threshold_1.m_data[0] = (pDVar3->coordMin).m_data[0] * (float)local_1f8;
      threshold_1.m_data[3] = (pDVar3->coordMin).m_data[3] * uStack_1f0._4_4_;
      threshold_1.m_data[2] = (pDVar3->coordMin).m_data[2] * (float)uStack_1f0;
      res_15.m_data[1] = (pDVar3->coordMax).m_data[1] * local_1f8._4_4_;
      res_15.m_data[0] = (pDVar3->coordMax).m_data[0] * (float)local_1f8;
      res_15.m_data[3] = (pDVar3->coordMax).m_data[3] * uStack_1f0._4_4_;
      res_15.m_data[2] = (pDVar3->coordMax).m_data[2] * (float)uStack_1f0;
      getDerivateThreshold((anon_unknown_0 *)&res_3,precision,&threshold_1,&res_15,&reference);
      uVar15 = -(uint)(fVar23 <= threshold.m_data[2]);
      uVar17 = -(uint)(fVar25 <= threshold.m_data[3]);
      fVar30 = (float)(~-(uint)(res_3.m_data[0] <= threshold.m_data[0]) & (uint)res_3.m_data[0] |
                      (uint)threshold.m_data[0] & -(uint)(res_3.m_data[0] <= threshold.m_data[0]));
      fVar34 = (float)(~-(uint)(res_3.m_data[1] <= threshold.m_data[1]) & (uint)res_3.m_data[1] |
                      (uint)threshold.m_data[1] & -(uint)(res_3.m_data[1] <= threshold.m_data[1]));
      fVar23 = (float)(~uVar15 & (uint)fVar23 | (uint)threshold.m_data[2] & uVar15);
      fVar25 = (float)(~uVar17 & (uint)fVar25 | (uint)threshold.m_data[3] & uVar17);
      uVar15 = -(uint)(fVar30 <= surfaceThreshold.m_data[0]);
      uVar17 = -(uint)(fVar34 <= surfaceThreshold.m_data[1]);
      uVar16 = -(uint)(fVar23 <= surfaceThreshold.m_data[2]);
      uVar18 = -(uint)(fVar25 <= surfaceThreshold.m_data[3]);
      threshold_1.m_data[1] =
           (float)(~uVar17 & (uint)fVar34 | (uint)surfaceThreshold.m_data[1] & uVar17);
      threshold_1.m_data[0] =
           (float)(~uVar15 & (uint)fVar30 | (uint)surfaceThreshold.m_data[0] & uVar15);
      threshold_1.m_data[3] =
           (float)(~uVar18 & (uint)fVar25 | (uint)surfaceThreshold.m_data[3] & uVar18);
      threshold_1.m_data[2] =
           (float)(~uVar16 & (uint)fVar23 | (uint)surfaceThreshold.m_data[2] & uVar16);
      bVar6 = verifyConstantDerivate
                        (((this->super_TriangleDerivateCaseInstance).super_ShaderRenderCaseInstance.
                          super_TestInstance.m_context)->m_testCtx->m_log,local_1e0,
                         (PixelBufferAccess *)sig,pDVar2->dataType,&opThreshold,&threshold_1,
                         local_218,&pDVar3->derivBias,LOG_ALL);
      return (int)CONCAT71(extraout_var,bVar6);
    }
    puVar9 = &local_1f8;
    lVar11 = 0xc;
  }
  local_218 = (Vec4 *)*puVar9;
  uStack_210 = puVar9[1];
  auVar20._0_4_ = (float)*(int *)(ctx + lVar11);
  auVar31._0_4_ = (pDVar3->coordMax).m_data[0] - (pDVar3->coordMin).m_data[0];
  auVar31._4_4_ = (pDVar3->coordMax).m_data[1] - (pDVar3->coordMin).m_data[1];
  auVar31._8_4_ = (pDVar3->coordMax).m_data[2] - (pDVar3->coordMin).m_data[2];
  auVar31._12_4_ = (pDVar3->coordMax).m_data[3] - (pDVar3->coordMin).m_data[3];
  auVar20._4_4_ = auVar20._0_4_;
  auVar20._8_4_ = auVar20._0_4_;
  auVar20._12_4_ = auVar20._0_4_;
  reference.m_data = (float  [4])divps(auVar31,auVar20);
  getDerivateThreshold
            ((anon_unknown_0 *)&opThreshold,pDVar2->precision,&pDVar3->coordMin,&pDVar3->coordMax,
             &reference);
  threshold.m_data[0] =
       (float)(~-(uint)(opThreshold.m_data[0] <= surfaceThreshold.m_data[0]) &
               (uint)opThreshold.m_data[0] |
              (uint)surfaceThreshold.m_data[0] &
              -(uint)(opThreshold.m_data[0] <= surfaceThreshold.m_data[0]));
  threshold.m_data[1] =
       (float)(~-(uint)(opThreshold.m_data[1] <= surfaceThreshold.m_data[1]) &
               (uint)opThreshold.m_data[1] |
              (uint)surfaceThreshold.m_data[1] &
              -(uint)(opThreshold.m_data[1] <= surfaceThreshold.m_data[1]));
  threshold.m_data[2] =
       (float)(~-(uint)(opThreshold.m_data[2] <= surfaceThreshold.m_data[2]) &
               (uint)opThreshold.m_data[2] |
              (uint)surfaceThreshold.m_data[2] &
              -(uint)(opThreshold.m_data[2] <= surfaceThreshold.m_data[2]));
  threshold.m_data[3] =
       (float)(~-(uint)(opThreshold.m_data[3] <= surfaceThreshold.m_data[3]) &
               (uint)opThreshold.m_data[3] |
              (uint)surfaceThreshold.m_data[3] &
              -(uint)(opThreshold.m_data[3] <= surfaceThreshold.m_data[3]));
  DVar7 = glu::getDataTypeFloatScalars(pDVar2->dataType);
  reference.m_data[1] = local_218._4_4_ * reference.m_data[1];
  reference.m_data[0] = (float)local_218 * reference.m_data[0];
  reference.m_data[2] = (float)uStack_210 * reference.m_data[2];
  reference.m_data[3] = uStack_210._4_4_ * reference.m_data[3];
  poVar1 = (ostringstream *)(function.matrix.m_data.m_data[0].m_data + 2);
  function.matrix.m_data.m_data[0].m_data._0_8_ =
       ((this->super_TriangleDerivateCaseInstance).super_ShaderRenderCaseInstance.super_TestInstance
       .m_context)->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Verifying result image.\n",0x18);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"\tValid derivative is ",0x15);
  VVar5 = reference;
  if (DVar7 == TYPE_FLOAT_VEC3) {
    res_3.m_data[0] = reference.m_data[0];
    res_3.m_data[1] = reference.m_data[1];
    reference = VVar5;
    tcu::operator<<((ostream *)poVar1,(Vector<float,_3> *)&res_3);
  }
  else if (DVar7 == TYPE_FLOAT_VEC2) {
    res_3.m_data[0] = reference.m_data[0];
    res_3.m_data[1] = reference.m_data[1];
    reference = VVar5;
    tcu::operator<<((ostream *)poVar1,&res_3);
  }
  else if (DVar7 == TYPE_FLOAT) {
    std::ostream::_M_insert<double>((double)reference.m_data[0]);
  }
  else {
    tcu::operator<<((ostream *)poVar1,&reference);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," with threshold ",0x10);
  if (DVar7 == TYPE_FLOAT_VEC3) {
    res_3.m_data[1] = threshold.m_data[1];
    res_3.m_data[0] = threshold.m_data[0];
    tcu::operator<<((ostream *)poVar1,(Vector<float,_3> *)&res_3);
  }
  else if (DVar7 == TYPE_FLOAT_VEC2) {
    res_3.m_data[1] = threshold.m_data[1];
    res_3.m_data[0] = threshold.m_data[0];
    tcu::operator<<((ostream *)poVar1,&res_3);
  }
  else if (DVar7 == TYPE_FLOAT) {
    std::ostream::_M_insert<double>((double)threshold.m_data[0]);
  }
  else {
    tcu::operator<<((ostream *)poVar1,&threshold);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&function,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_140);
  pDVar3 = (this->super_TriangleDerivateCaseInstance).m_values;
  bVar6 = verifyConstantDerivate
                    (((this->super_TriangleDerivateCaseInstance).super_ShaderRenderCaseInstance.
                      super_TestInstance.m_context)->m_testCtx->m_log,(ConstPixelBufferAccess *)ctx,
                     (PixelBufferAccess *)sig,
                     ((this->super_TriangleDerivateCaseInstance).m_definitions)->dataType,&reference
                     ,&threshold,&pDVar3->derivScale,&pDVar3->derivBias,LOG_NOTHING);
  if (bVar6) {
    poVar1 = (ostringstream *)(function.matrix.m_data.m_data[0].m_data + 2);
    function.matrix.m_data.m_data[0].m_data._0_8_ =
         ((this->super_TriangleDerivateCaseInstance).super_ShaderRenderCaseInstance.
          super_TestInstance.m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"No incorrect derivatives found, result valid.",0x2d);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&function,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    uVar10 = std::ios_base::~ios_base(local_140);
    iVar8 = (int)CONCAT71((int7)((ulong)uVar10 >> 8),1);
  }
  else {
    poVar1 = (ostringstream *)(function.matrix.m_data.m_data[0].m_data + 2);
    function.matrix.m_data.m_data[0].m_data._0_8_ =
         ((this->super_TriangleDerivateCaseInstance).super_ShaderRenderCaseInstance.
          super_TestInstance.m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Initial verification failed, verifying image by calculating accurate error bounds for each result pixel.\n"
               ,0x69);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "\tVerifying each result derivative is within its range of legal result values.",0x4d
              );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&function,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_140);
    pDVar3 = (this->super_TriangleDerivateCaseInstance).m_values;
    fVar23 = (pDVar3->coordMin).m_data[0];
    fVar25 = (pDVar3->coordMin).m_data[1];
    fVar30 = (pDVar3->coordMax).m_data[0];
    fVar34 = (pDVar3->coordMax).m_data[1];
    fVar24 = (pDVar3->coordMax).m_data[2] - (pDVar3->coordMin).m_data[2];
    auVar22._12_4_ = (pDVar3->coordMax).m_data[3] - (pDVar3->coordMin).m_data[3];
    function.matrix.m_data.m_data[2].m_data[0] = 0.0;
    function.matrix.m_data.m_data[2].m_data[1] = 0.0;
    function.matrix.m_data.m_data[2].m_data[2] = 0.0;
    function.matrix.m_data.m_data[2].m_data[3] = 0.0;
    function.matrix.m_data.m_data[1].m_data[0] = 0.0;
    function.matrix.m_data.m_data[1].m_data[1] = 0.0;
    function.matrix.m_data.m_data[1].m_data[2] = 0.0;
    function.matrix.m_data.m_data[1].m_data[3] = 0.0;
    function.matrix.m_data.m_data[0].m_data = (float  [4])ZEXT816(0);
    pVVar12 = function.matrix.m_data.m_data + 1;
    lVar11 = 0;
    lVar14 = 0;
    do {
      lVar13 = 0;
      auVar36 = _DAT_00a99400;
      do {
        bVar6 = SUB164(auVar36 ^ _DAT_00a99450,4) == -0x80000000 &&
                SUB164(auVar36 ^ _DAT_00a99450,0) < -0x7ffffffd;
        if (bVar6) {
          uVar38 = 0x3f800000;
          if (lVar11 != lVar13) {
            uVar38 = 0;
          }
          *(undefined4 *)
           ((long)((Vector<tcu::Vector<float,_4>,_3> *)(pVVar12 + -1))->m_data[0].m_data + lVar13) =
               uVar38;
        }
        if (bVar6) {
          uVar38 = 0x3f800000;
          if (lVar11 + -0x10 != lVar13) {
            uVar38 = 0;
          }
          *(undefined4 *)((long)pVVar12->m_data + lVar13) = uVar38;
        }
        lVar37 = auVar36._8_8_;
        auVar36._0_8_ = auVar36._0_8_ + 2;
        auVar36._8_8_ = lVar37 + 2;
        lVar13 = lVar13 + 0x20;
      } while (lVar13 != 0x40);
      lVar14 = lVar14 + 1;
      lVar11 = lVar11 + 0x10;
      pVVar12 = (Vector<float,_4> *)(pVVar12->m_data + 1);
    } while (lVar14 != 4);
    res_3.m_data[1] = 0.0;
    res_3.m_data[0] = (fVar30 - fVar23) / 99.0;
    lVar11 = 0;
    do {
      function.matrix.m_data.m_data[0].m_data[lVar11] = *(float *)((long)res_3.m_data + lVar11);
      lVar11 = lVar11 + 4;
    } while (lVar11 != 0xc);
    res_3.m_data = (float  [2])((ulong)(uint)((fVar34 - fVar25) / 133.0) << 0x20);
    lVar11 = 1;
    do {
      function.matrix.m_data.m_data[0].m_data[lVar11] =
           *(float *)((long)threshold_1.m_data + lVar11 + -0x11);
      lVar11 = lVar11 + 4;
    } while (lVar11 != 0xd);
    fVar23 = (pDVar3->coordMin).m_data[2];
    auVar33._4_4_ = fVar24;
    auVar33._0_4_ = fVar24;
    auVar33._8_4_ = auVar22._12_4_;
    auVar33._12_4_ = auVar22._12_4_;
    auVar26 = divps(auVar33,_DAT_00aeac10);
    threshold_1.m_data[0] = (float)auVar26._0_8_;
    threshold_1.m_data[1] = SUB84(auVar26._0_8_,4);
    threshold_1.m_data[2] = fVar23 + fVar23;
    res_3.m_data[0] = 0.0;
    res_3.m_data[1] = 0.0;
    lVar11 = 0;
    do {
      res_3.m_data[lVar11] = threshold_1.m_data[lVar11] * 0.5;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 3);
    lVar11 = 2;
    do {
      function.matrix.m_data.m_data[0].m_data[lVar11] =
           *(float *)((long)threshold_1.m_data + lVar11 + -0x12);
      lVar11 = lVar11 + 4;
    } while (lVar11 != 0xe);
    fVar23 = (pDVar3->coordMax).m_data[3];
    auVar22._4_4_ = auVar22._12_4_;
    auVar22._0_4_ = auVar22._12_4_;
    auVar22._8_4_ = auVar22._12_4_;
    auVar26 = divps(auVar22,_DAT_00aeac20);
    threshold_1.m_data[0] = (float)auVar26._0_8_;
    threshold_1.m_data[1] = SUB84(auVar26._0_8_,4);
    threshold_1.m_data[2] = fVar23 + fVar23;
    res_3.m_data[0] = 0.0;
    res_3.m_data[1] = 0.0;
    lVar11 = 0;
    do {
      res_3.m_data[lVar11] = threshold_1.m_data[lVar11] * 0.5;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 3);
    lVar11 = 3;
    do {
      function.matrix.m_data.m_data[0].m_data[lVar11] =
           *(float *)((long)threshold_1.m_data + lVar11 + -0x13);
      lVar11 = lVar11 + 4;
    } while (lVar11 != 0xf);
    pDVar2 = (this->super_TriangleDerivateCaseInstance).m_definitions;
    bVar6 = reverifyConstantDerivateWithFlushRelaxations
                      (((this->super_TriangleDerivateCaseInstance).super_ShaderRenderCaseInstance.
                        super_TestInstance.m_context)->m_testCtx->m_log,
                       (ConstPixelBufferAccess *)ctx,(PixelBufferAccess *)sig,pDVar2->dataType,
                       pDVar2->precision,&pDVar3->derivScale,&pDVar3->derivBias,&surfaceThreshold,
                       pDVar2->func,&function);
    iVar8 = (int)CONCAT71(extraout_var_00,bVar6);
  }
  return iVar8;
}

Assistant:

bool LinearDerivateCaseInstance::verify (const tcu::ConstPixelBufferAccess& result, const tcu::PixelBufferAccess& errorMask)
{
	const tcu::Vec4		xScale				= tcu::Vec4(1.0f, 0.0f, 0.5f, -0.5f);
	const tcu::Vec4		yScale				= tcu::Vec4(0.0f, 1.0f, 0.5f, -0.5f);
	const tcu::Vec4		surfaceThreshold	= getSurfaceThreshold() / abs(m_values.derivScale);

	if (isDfdxFunc(m_definitions.func) || isDfdyFunc(m_definitions.func))
	{
		const bool			isX			= isDfdxFunc(m_definitions.func);
		const float			div			= isX ? float(result.getWidth()) : float(result.getHeight());
		const tcu::Vec4		scale		= isX ? xScale : yScale;
		tcu::Vec4			reference	= ((m_values.coordMax - m_values.coordMin) / div);
		const tcu::Vec4		opThreshold	= getDerivateThreshold(m_definitions.precision, m_values.coordMin, m_values.coordMax, reference);
		const tcu::Vec4		threshold	= max(surfaceThreshold, opThreshold);
		const int			numComps	= glu::getDataTypeFloatScalars(m_definitions.dataType);

		/* adjust the reference value for the correct dfdx or dfdy sample adjacency */
		reference = reference * scale;

		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message
			<< "Verifying result image.\n"
			<< "\tValid derivative is " << LogVecComps(reference, numComps) << " with threshold " << LogVecComps(threshold, numComps)
			<< tcu::TestLog::EndMessage;

		// short circuit if result is strictly within the normal value error bounds.
		// This improves performance significantly.
		if (verifyConstantDerivate(m_context.getTestContext().getLog(), result, errorMask, m_definitions.dataType,
								   reference, threshold, m_values.derivScale, m_values.derivBias,
								   LOG_NOTHING))
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "No incorrect derivatives found, result valid."
				<< tcu::TestLog::EndMessage;

			return true;
		}

		// some pixels exceed error bounds calculated for normal values. Verify that these
		// potentially invalid pixels are in fact valid due to (for example) subnorm flushing.

		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message
			<< "Initial verification failed, verifying image by calculating accurate error bounds for each result pixel.\n"
			<< "\tVerifying each result derivative is within its range of legal result values."
			<< tcu::TestLog::EndMessage;

		{
			const tcu::UVec2			viewportSize	(VIEWPORT_WIDTH, VIEWPORT_HEIGHT);
			const float					w				= float(viewportSize.x());
			const float					h				= float(viewportSize.y());
			const tcu::Vec4				valueRamp		= (m_values.coordMax - m_values.coordMin);
			Linear2DFunctionEvaluator	function;

			function.matrix.setRow(0, tcu::Vec3(valueRamp.x() / w, 0.0f, m_values.coordMin.x()));
			function.matrix.setRow(1, tcu::Vec3(0.0f, valueRamp.y() / h, m_values.coordMin.y()));
			function.matrix.setRow(2, tcu::Vec3(valueRamp.z() / w, valueRamp.z() / h, m_values.coordMin.z() + m_values.coordMin.z()) / 2.0f);
			function.matrix.setRow(3, tcu::Vec3(-valueRamp.w() / w, -valueRamp.w() / h, m_values.coordMax.w() + m_values.coordMax.w()) / 2.0f);

			return reverifyConstantDerivateWithFlushRelaxations(m_context.getTestContext().getLog(), result, errorMask,
																m_definitions.dataType, m_definitions.precision, m_values.derivScale,
																m_values.derivBias, surfaceThreshold, m_definitions.func,
																function);
		}
	}
	else
	{
		DE_ASSERT(isFwidthFunc(m_definitions.func));
		const float			w			= float(result.getWidth());
		const float			h			= float(result.getHeight());

		const tcu::Vec4		dx			= ((m_values.coordMax - m_values.coordMin) / w) * xScale;
		const tcu::Vec4		dy			= ((m_values.coordMax - m_values.coordMin) / h) * yScale;
		const tcu::Vec4		reference	= tcu::abs(dx) + tcu::abs(dy);
		const tcu::Vec4		dxThreshold	= getDerivateThreshold(m_definitions.precision, m_values.coordMin*xScale, m_values.coordMax*xScale, dx);
		const tcu::Vec4		dyThreshold	= getDerivateThreshold(m_definitions.precision, m_values.coordMin*yScale, m_values.coordMax*yScale, dy);
		const tcu::Vec4		threshold	= max(surfaceThreshold, max(dxThreshold, dyThreshold));

		return verifyConstantDerivate(m_context.getTestContext().getLog(), result, errorMask, m_definitions.dataType,
									  reference, threshold, m_values.derivScale, m_values.derivBias);
	}
}